

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O1

bool embree::avx512::
     BVHNIntersector1<8,_1,_false,_embree::avx512::ArrayIntersector1<embree::avx512::ObjectIntersector1<false>_>_>
     ::pointQuery(Intersectors *This,PointQuery *query,PointQueryContext *context)

{
  float *pfVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  undefined4 uVar5;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar6;
  uint uVar7;
  Geometry *this;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined8 uVar20;
  undefined8 uVar21;
  undefined8 uVar22;
  undefined8 uVar23;
  undefined8 uVar24;
  undefined8 uVar25;
  undefined8 uVar26;
  byte bVar27;
  bool bVar28;
  bool bVar29;
  int iVar30;
  ulong uVar31;
  ulong in_R8;
  ulong *puVar32;
  byte bVar33;
  long lVar34;
  ulong uVar35;
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [64];
  undefined1 auVar47 [32];
  undefined1 in_ZMM7 [64];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [16];
  undefined1 auVar51 [64];
  undefined1 auVar52 [32];
  undefined1 auVar53 [64];
  undefined1 auVar54 [64];
  undefined1 in_ZMM15 [64];
  undefined1 auVar55 [64];
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  ulong local_2378;
  undefined4 local_2370;
  ulong local_2368 [1127];
  
  if (*(long *)&This->ptr[1].bounds.bounds0.lower.field_0 == 8) {
    return false;
  }
  local_2378 = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
  local_2370 = 0;
  if (context->query_type == POINT_QUERY_TYPE_SPHERE) {
    auVar51 = ZEXT464((uint)(query->radius * query->radius));
  }
  else {
    aVar6 = (context->query_radius).field_0;
    auVar50 = vdpps_avx((undefined1  [16])aVar6,(undefined1  [16])aVar6,0x7f);
    auVar51 = ZEXT1664(auVar50);
  }
  puVar32 = local_2368;
  fVar2 = (query->p).field_0.field_0.x;
  auVar48._4_4_ = fVar2;
  auVar48._0_4_ = fVar2;
  auVar48._8_4_ = fVar2;
  auVar48._12_4_ = fVar2;
  auVar48._16_4_ = fVar2;
  auVar48._20_4_ = fVar2;
  auVar48._24_4_ = fVar2;
  auVar48._28_4_ = fVar2;
  fVar3 = (query->p).field_0.field_0.y;
  auVar49._4_4_ = fVar3;
  auVar49._0_4_ = fVar3;
  auVar49._8_4_ = fVar3;
  auVar49._12_4_ = fVar3;
  auVar49._16_4_ = fVar3;
  auVar49._20_4_ = fVar3;
  auVar49._24_4_ = fVar3;
  auVar49._28_4_ = fVar3;
  fVar4 = (query->p).field_0.field_0.z;
  auVar52._4_4_ = fVar4;
  auVar52._0_4_ = fVar4;
  auVar52._8_4_ = fVar4;
  auVar52._12_4_ = fVar4;
  auVar52._16_4_ = fVar4;
  auVar52._20_4_ = fVar4;
  auVar52._24_4_ = fVar4;
  auVar52._28_4_ = fVar4;
  uVar5 = *(undefined4 *)&(context->query_radius).field_0;
  auVar42._4_4_ = uVar5;
  auVar42._0_4_ = uVar5;
  auVar42._8_4_ = uVar5;
  auVar42._12_4_ = uVar5;
  auVar42._16_4_ = uVar5;
  auVar42._20_4_ = uVar5;
  auVar42._24_4_ = uVar5;
  auVar42._28_4_ = uVar5;
  uVar5 = *(undefined4 *)((long)&(context->query_radius).field_0 + 4);
  auVar43._4_4_ = uVar5;
  auVar43._0_4_ = uVar5;
  auVar43._8_4_ = uVar5;
  auVar43._12_4_ = uVar5;
  auVar43._16_4_ = uVar5;
  auVar43._20_4_ = uVar5;
  auVar43._24_4_ = uVar5;
  auVar43._28_4_ = uVar5;
  uVar5 = *(undefined4 *)((long)&(context->query_radius).field_0 + 8);
  auVar38._4_4_ = uVar5;
  auVar38._0_4_ = uVar5;
  auVar38._8_4_ = uVar5;
  auVar38._12_4_ = uVar5;
  auVar38._16_4_ = uVar5;
  auVar38._20_4_ = uVar5;
  auVar38._24_4_ = uVar5;
  auVar38._28_4_ = uVar5;
  bVar29 = false;
  auVar19 = vpmovsxbd_avx2(ZEXT816(0x706050403020100));
  auVar53 = ZEXT3264(auVar19);
  auVar54 = ZEXT3264(CONCAT428(0xfffffff8,
                               CONCAT424(0xfffffff8,
                                         CONCAT420(0xfffffff8,
                                                   CONCAT416(0xfffffff8,
                                                             CONCAT412(0xfffffff8,
                                                                       CONCAT48(0xfffffff8,
                                                                                0xfffffff8fffffff8))
                                                            )))));
  do {
    auVar19 = vsubps_avx(auVar48,auVar42);
    fVar8 = auVar42._0_4_;
    fVar9 = auVar42._4_4_;
    fVar10 = auVar42._8_4_;
    fVar11 = auVar42._12_4_;
    fVar12 = auVar42._16_4_;
    fVar13 = auVar42._20_4_;
    fVar14 = auVar42._24_4_;
    auVar16 = vsubps_avx(auVar49,auVar43);
    auVar17 = vsubps_avx(auVar52,auVar38);
    auVar44._0_4_ = fVar4 + auVar38._0_4_;
    auVar44._4_4_ = fVar4 + auVar38._4_4_;
    auVar44._8_4_ = fVar4 + auVar38._8_4_;
    auVar44._12_4_ = fVar4 + auVar38._12_4_;
    auVar44._16_4_ = fVar4 + auVar38._16_4_;
    auVar44._20_4_ = fVar4 + auVar38._20_4_;
    auVar44._24_4_ = fVar4 + auVar38._24_4_;
    auVar44._28_4_ = fVar4 + auVar38._28_4_;
    auVar55._0_4_ = fVar8 * fVar8;
    auVar55._4_4_ = fVar9 * fVar9;
    auVar55._8_4_ = fVar10 * fVar10;
    auVar55._12_4_ = fVar11 * fVar11;
    auVar55._16_4_ = fVar12 * fVar12;
    auVar55._20_4_ = fVar13 * fVar13;
    auVar55._28_36_ = in_ZMM15._28_36_;
    auVar55._24_4_ = fVar14 * fVar14;
    in_ZMM15 = ZEXT3264(auVar55._0_32_);
    auVar50 = auVar51._0_16_;
    do {
      do {
        do {
          if (puVar32 == &local_2378) {
            return bVar29;
          }
          pfVar1 = (float *)(puVar32 + -1);
          puVar32 = puVar32 + -2;
        } while (auVar51._0_4_ < *pfVar1);
        uVar35 = *puVar32;
        do {
          if (context->query_type == POINT_QUERY_TYPE_SPHERE) {
            if ((uVar35 & 8) == 0) {
              auVar38 = vmaxps_avx(auVar48,*(undefined1 (*) [32])(uVar35 + 0x40));
              auVar38 = vminps_avx(auVar38,*(undefined1 (*) [32])(uVar35 + 0x60));
              auVar36 = vsubps_avx(auVar38,auVar48);
              auVar38 = vmaxps_avx(auVar49,*(undefined1 (*) [32])(uVar35 + 0x80));
              auVar15 = vminps_avx(auVar38,*(undefined1 (*) [32])(uVar35 + 0xa0));
              auVar38 = vmaxps_avx(auVar52,*(undefined1 (*) [32])(uVar35 + 0xc0));
              auVar15 = vsubps_avx(auVar15,auVar49);
              auVar38 = vminps_avx(auVar38,*(undefined1 (*) [32])(uVar35 + 0xe0));
              auVar38 = vsubps_avx(auVar38,auVar52);
              auVar37._0_4_ =
                   auVar36._0_4_ * auVar36._0_4_ + auVar15._0_4_ * auVar15._0_4_ +
                   auVar38._0_4_ * auVar38._0_4_;
              auVar37._4_4_ =
                   auVar36._4_4_ * auVar36._4_4_ + auVar15._4_4_ * auVar15._4_4_ +
                   auVar38._4_4_ * auVar38._4_4_;
              auVar37._8_4_ =
                   auVar36._8_4_ * auVar36._8_4_ + auVar15._8_4_ * auVar15._8_4_ +
                   auVar38._8_4_ * auVar38._8_4_;
              auVar37._12_4_ =
                   auVar36._12_4_ * auVar36._12_4_ + auVar15._12_4_ * auVar15._12_4_ +
                   auVar38._12_4_ * auVar38._12_4_;
              auVar37._16_4_ =
                   auVar36._16_4_ * auVar36._16_4_ + auVar15._16_4_ * auVar15._16_4_ +
                   auVar38._16_4_ * auVar38._16_4_;
              auVar37._20_4_ =
                   auVar36._20_4_ * auVar36._20_4_ + auVar15._20_4_ * auVar15._20_4_ +
                   auVar38._20_4_ * auVar38._20_4_;
              auVar37._24_4_ =
                   auVar36._24_4_ * auVar36._24_4_ + auVar15._24_4_ * auVar15._24_4_ +
                   auVar38._24_4_ * auVar38._24_4_;
              auVar37._28_4_ = auVar36._28_4_ + auVar15._28_4_ + auVar15._28_4_;
              in_ZMM7 = ZEXT3264(auVar37);
              uVar20 = vcmpps_avx512vl(auVar37,in_ZMM15._0_32_,2);
              uVar21 = vcmpps_avx512vl(*(undefined1 (*) [32])(uVar35 + 0x40),
                                       *(undefined1 (*) [32])(uVar35 + 0x60),2);
              in_R8 = CONCAT44((int)(in_R8 >> 0x20),(uint)(byte)((byte)uVar20 & (byte)uVar21));
            }
          }
          else if ((uVar35 & 8) == 0) {
            auVar38 = *(undefined1 (*) [32])(uVar35 + 0x40);
            auVar15 = *(undefined1 (*) [32])(uVar35 + 0x60);
            auVar36 = vmaxps_avx(auVar48,auVar38);
            auVar36 = vminps_avx(auVar36,auVar15);
            auVar37 = vsubps_avx(auVar36,auVar48);
            auVar36 = vmaxps_avx(auVar49,*(undefined1 (*) [32])(uVar35 + 0x80));
            auVar36 = vminps_avx(auVar36,*(undefined1 (*) [32])(uVar35 + 0xa0));
            auVar40 = vsubps_avx(auVar36,auVar49);
            auVar36 = vmaxps_avx(auVar52,*(undefined1 (*) [32])(uVar35 + 0xc0));
            auVar36 = vminps_avx(auVar36,*(undefined1 (*) [32])(uVar35 + 0xe0));
            auVar36 = vsubps_avx(auVar36,auVar52);
            in_ZMM7 = ZEXT3264(CONCAT428(auVar37._28_4_ + auVar40._28_4_ + auVar40._28_4_,
                                         CONCAT424(auVar37._24_4_ * auVar37._24_4_ +
                                                   auVar40._24_4_ * auVar40._24_4_ +
                                                   auVar36._24_4_ * auVar36._24_4_,
                                                   CONCAT420(auVar37._20_4_ * auVar37._20_4_ +
                                                             auVar40._20_4_ * auVar40._20_4_ +
                                                             auVar36._20_4_ * auVar36._20_4_,
                                                             CONCAT416(auVar37._16_4_ *
                                                                       auVar37._16_4_ +
                                                                       auVar40._16_4_ *
                                                                       auVar40._16_4_ +
                                                                       auVar36._16_4_ *
                                                                       auVar36._16_4_,
                                                                       CONCAT412(auVar37._12_4_ *
                                                                                 auVar37._12_4_ +
                                                                                 auVar40._12_4_ *
                                                                                 auVar40._12_4_ +
                                                                                 auVar36._12_4_ *
                                                                                 auVar36._12_4_,
                                                                                 CONCAT48(auVar37.
                                                  _8_4_ * auVar37._8_4_ +
                                                  auVar40._8_4_ * auVar40._8_4_ +
                                                  auVar36._8_4_ * auVar36._8_4_,
                                                  CONCAT44(auVar37._4_4_ * auVar37._4_4_ +
                                                           auVar40._4_4_ * auVar40._4_4_ +
                                                           auVar36._4_4_ * auVar36._4_4_,
                                                           auVar37._0_4_ * auVar37._0_4_ +
                                                           auVar40._0_4_ * auVar40._0_4_ +
                                                           auVar36._0_4_ * auVar36._0_4_))))))));
            uVar20 = vcmpps_avx512vl(auVar38,auVar15,2);
            uVar21 = vcmpps_avx512vl(auVar15,auVar19,1);
            auVar36._4_4_ = fVar2 + fVar9;
            auVar36._0_4_ = fVar2 + fVar8;
            auVar36._8_4_ = fVar2 + fVar10;
            auVar36._12_4_ = fVar2 + fVar11;
            auVar36._16_4_ = fVar2 + fVar12;
            auVar36._20_4_ = fVar2 + fVar13;
            auVar36._24_4_ = fVar2 + fVar14;
            auVar36._28_4_ = fVar2 + auVar42._28_4_;
            uVar22 = vcmpps_avx512vl(auVar38,auVar36,6);
            uVar23 = vcmpps_avx512vl(*(undefined1 (*) [32])(uVar35 + 0xa0),auVar16,1);
            auVar15._4_4_ = fVar3 + auVar43._4_4_;
            auVar15._0_4_ = fVar3 + auVar43._0_4_;
            auVar15._8_4_ = fVar3 + auVar43._8_4_;
            auVar15._12_4_ = fVar3 + auVar43._12_4_;
            auVar15._16_4_ = fVar3 + auVar43._16_4_;
            auVar15._20_4_ = fVar3 + auVar43._20_4_;
            auVar15._24_4_ = fVar3 + auVar43._24_4_;
            auVar15._28_4_ = fVar3 + auVar43._28_4_;
            uVar24 = vcmpps_avx512vl(*(undefined1 (*) [32])(uVar35 + 0x80),auVar15,6);
            uVar25 = vcmpps_avx512vl(*(undefined1 (*) [32])(uVar35 + 0xe0),auVar17,1);
            uVar26 = vcmpps_avx512vl(*(undefined1 (*) [32])(uVar35 + 0xc0),auVar44,6);
            in_R8 = (ulong)(byte)(~((byte)uVar24 | (byte)uVar22 | (byte)uVar26 | (byte)uVar21 |
                                   (byte)uVar23 | (byte)uVar25) & (byte)uVar20);
          }
          if ((uVar35 & 8) == 0) {
            if (in_R8 == 0) {
              iVar30 = 4;
            }
            else {
              auVar38 = *(undefined1 (*) [32])(uVar35 & 0xfffffffffffffff0);
              auVar15 = ((undefined1 (*) [32])(uVar35 & 0xfffffffffffffff0))[1];
              auVar47 = in_ZMM7._0_32_;
              auVar36 = vpternlogd_avx512vl(auVar53._0_32_,auVar47,auVar54._0_32_,0xf8);
              uVar35 = in_R8 & 0xffffffff;
              auVar37 = vpcompressd_avx512vl(auVar36);
              bVar28 = (bool)((byte)uVar35 & 1);
              auVar40._0_4_ = (uint)bVar28 * auVar37._0_4_ | (uint)!bVar28 * auVar36._0_4_;
              bVar28 = (bool)((byte)(uVar35 >> 1) & 1);
              auVar40._4_4_ = (uint)bVar28 * auVar37._4_4_ | (uint)!bVar28 * auVar36._4_4_;
              bVar28 = (bool)((byte)(uVar35 >> 2) & 1);
              auVar40._8_4_ = (uint)bVar28 * auVar37._8_4_ | (uint)!bVar28 * auVar36._8_4_;
              bVar28 = (bool)((byte)(uVar35 >> 3) & 1);
              auVar40._12_4_ = (uint)bVar28 * auVar37._12_4_ | (uint)!bVar28 * auVar36._12_4_;
              bVar28 = (bool)((byte)(uVar35 >> 4) & 1);
              auVar40._16_4_ = (uint)bVar28 * auVar37._16_4_ | (uint)!bVar28 * auVar36._16_4_;
              bVar28 = (bool)((byte)(uVar35 >> 5) & 1);
              auVar40._20_4_ = (uint)bVar28 * auVar37._20_4_ | (uint)!bVar28 * auVar36._20_4_;
              bVar28 = (bool)((byte)(uVar35 >> 6) & 1);
              auVar40._24_4_ = (uint)bVar28 * auVar37._24_4_ | (uint)!bVar28 * auVar36._24_4_;
              bVar28 = (bool)((byte)(uVar35 >> 7) & 1);
              auVar40._28_4_ = (uint)bVar28 * auVar37._28_4_ | (uint)!bVar28 * auVar36._28_4_;
              auVar36 = vpermt2q_avx512vl(auVar38,auVar40,auVar15);
              uVar35 = auVar36._0_8_;
              iVar30 = 0;
              uVar31 = in_R8 - 1 & in_R8;
              if (uVar31 != 0) {
                auVar36 = vpshufd_avx2(auVar40,0x55);
                vpermt2q_avx512vl(auVar38,auVar36,auVar15);
                auVar37 = vpminsd_avx2(auVar40,auVar36);
                auVar36 = vpmaxsd_avx2(auVar40,auVar36);
                uVar31 = uVar31 - 1 & uVar31;
                if (uVar31 == 0) {
                  auVar37 = vpermi2q_avx512vl(auVar37,auVar38,auVar15);
                  uVar35 = auVar37._0_8_;
                  auVar38 = vpermt2q_avx512vl(auVar38,auVar36,auVar15);
                  *puVar32 = auVar38._0_8_;
                  auVar38 = vpermd_avx2(auVar36,auVar47);
                  *(int *)(puVar32 + 1) = auVar38._0_4_;
                  puVar32 = puVar32 + 2;
                }
                else {
                  auVar45 = vpshufd_avx2(auVar40,0xaa);
                  vpermt2q_avx512vl(auVar38,auVar45,auVar15);
                  auVar41 = vpminsd_avx2(auVar37,auVar45);
                  auVar37 = vpmaxsd_avx2(auVar37,auVar45);
                  auVar45 = vpminsd_avx2(auVar36,auVar37);
                  auVar36 = vpmaxsd_avx2(auVar36,auVar37);
                  uVar31 = uVar31 - 1 & uVar31;
                  if (uVar31 == 0) {
                    auVar37 = vpermi2q_avx512vl(auVar41,auVar38,auVar15);
                    uVar35 = auVar37._0_8_;
                    auVar37 = vpermt2q_avx512vl(auVar38,auVar36,auVar15);
                    *puVar32 = auVar37._0_8_;
                    auVar36 = vpermd_avx2(auVar36,auVar47);
                    *(int *)(puVar32 + 1) = auVar36._0_4_;
                    auVar38 = vpermt2q_avx512vl(auVar38,auVar45,auVar15);
                    puVar32[2] = auVar38._0_8_;
                    auVar38 = vpermd_avx2(auVar45,auVar47);
                    *(int *)(puVar32 + 3) = auVar38._0_4_;
                    puVar32 = puVar32 + 4;
                  }
                  else {
                    auVar37 = vpshufd_avx2(auVar40,0xff);
                    vpermt2q_avx512vl(auVar38,auVar37,auVar15);
                    auVar18 = vpminsd_avx2(auVar41,auVar37);
                    auVar37 = vpmaxsd_avx2(auVar41,auVar37);
                    auVar41 = vpminsd_avx2(auVar45,auVar37);
                    auVar37 = vpmaxsd_avx2(auVar45,auVar37);
                    auVar45 = vpminsd_avx2(auVar36,auVar37);
                    auVar36 = vpmaxsd_avx2(auVar36,auVar37);
                    uVar31 = uVar31 - 1 & uVar31;
                    if (uVar31 == 0) {
                      auVar37 = vpermi2q_avx512vl(auVar18,auVar38,auVar15);
                      uVar35 = auVar37._0_8_;
                      auVar37 = vpermt2q_avx512vl(auVar38,auVar36,auVar15);
                      *puVar32 = auVar37._0_8_;
                      auVar36 = vpermd_avx2(auVar36,auVar47);
                      *(int *)(puVar32 + 1) = auVar36._0_4_;
                      auVar36 = vpermt2q_avx512vl(auVar38,auVar45,auVar15);
                      puVar32[2] = auVar36._0_8_;
                      auVar36 = vpermd_avx2(auVar45,auVar47);
                      *(int *)(puVar32 + 3) = auVar36._0_4_;
                      auVar38 = vpermt2q_avx512vl(auVar38,auVar41,auVar15);
                      puVar32[4] = auVar38._0_8_;
                      auVar38 = vpermd_avx2(auVar41,auVar47);
                      *(int *)(puVar32 + 5) = auVar38._0_4_;
                      puVar32 = puVar32 + 6;
                    }
                    else {
                      auVar39 = valignd_avx512vl(auVar40,auVar40,3);
                      auVar37 = vpmovsxbd_avx2(ZEXT816(0x303020108));
                      auVar40 = vpermt2d_avx512vl(ZEXT1632(CONCAT412(0x80000000,
                                                                     CONCAT48(0x80000000,
                                                                              0x8000000080000000))),
                                                  auVar37,auVar18);
                      auVar37 = vpmovsxbd_avx2(ZEXT816(0x5040302010008));
                      auVar40 = vpermt2d_avx512vl(auVar40,auVar37,auVar41);
                      auVar40 = vpermt2d_avx512vl(auVar40,auVar37,auVar45);
                      auVar37 = vpmovsxbd_avx2(ZEXT816(0x605040302010008));
                      auVar36 = vpermt2d_avx512vl(auVar40,auVar37,auVar36);
                      auVar46 = ZEXT3264(auVar36);
                      uVar35 = uVar31;
                      do {
                        auVar37 = auVar46._0_32_;
                        auVar45._8_4_ = 1;
                        auVar45._0_8_ = 0x100000001;
                        auVar45._12_4_ = 1;
                        auVar45._16_4_ = 1;
                        auVar45._20_4_ = 1;
                        auVar45._24_4_ = 1;
                        auVar45._28_4_ = 1;
                        auVar36 = vpermd_avx2(auVar45,auVar39);
                        auVar39 = valignd_avx512vl(auVar39,auVar39,1);
                        vpermt2q_avx512vl(auVar38,auVar39,auVar15);
                        uVar35 = uVar35 - 1 & uVar35;
                        uVar20 = vpcmpd_avx512vl(auVar36,auVar37,5);
                        auVar36 = vpmaxsd_avx2(auVar36,auVar37);
                        bVar27 = (byte)uVar20 << 1;
                        auVar37 = valignd_avx512vl(auVar37,auVar37,7);
                        bVar28 = (bool)((byte)uVar20 & 1);
                        auVar41._4_4_ = (uint)bVar28 * auVar37._4_4_ | (uint)!bVar28 * auVar36._4_4_
                        ;
                        auVar41._0_4_ = auVar36._0_4_;
                        bVar28 = (bool)(bVar27 >> 2 & 1);
                        auVar41._8_4_ = (uint)bVar28 * auVar37._8_4_ | (uint)!bVar28 * auVar36._8_4_
                        ;
                        bVar28 = (bool)(bVar27 >> 3 & 1);
                        auVar41._12_4_ =
                             (uint)bVar28 * auVar37._12_4_ | (uint)!bVar28 * auVar36._12_4_;
                        bVar28 = (bool)(bVar27 >> 4 & 1);
                        auVar41._16_4_ =
                             (uint)bVar28 * auVar37._16_4_ | (uint)!bVar28 * auVar36._16_4_;
                        bVar28 = (bool)(bVar27 >> 5 & 1);
                        auVar41._20_4_ =
                             (uint)bVar28 * auVar37._20_4_ | (uint)!bVar28 * auVar36._20_4_;
                        bVar28 = (bool)(bVar27 >> 6 & 1);
                        auVar41._24_4_ =
                             (uint)bVar28 * auVar37._24_4_ | (uint)!bVar28 * auVar36._24_4_;
                        auVar41._28_4_ =
                             (uint)(bVar27 >> 7) * auVar37._28_4_ |
                             (uint)!(bool)(bVar27 >> 7) * auVar36._28_4_;
                        auVar46 = ZEXT3264(auVar41);
                      } while (uVar35 != 0);
                      lVar34 = POPCOUNT(uVar31) + 3;
                      do {
                        auVar36 = vpermi2q_avx512vl(auVar41,auVar38,auVar15);
                        *puVar32 = auVar36._0_8_;
                        auVar37 = auVar46._0_32_;
                        auVar36 = vpermd_avx2(auVar37,auVar47);
                        *(int *)(puVar32 + 1) = auVar36._0_4_;
                        auVar41 = valignd_avx512vl(auVar37,auVar37,1);
                        puVar32 = puVar32 + 2;
                        auVar46 = ZEXT3264(auVar41);
                        lVar34 = lVar34 + -1;
                      } while (lVar34 != 0);
                      auVar38 = vpermt2q_avx512vl(auVar38,auVar41,auVar15);
                      uVar35 = auVar38._0_8_;
                    }
                    in_ZMM7 = ZEXT3264(auVar47);
                    in_ZMM15 = ZEXT3264(in_ZMM15._0_32_);
                    iVar30 = 0;
                  }
                }
              }
            }
          }
          else {
            iVar30 = 6;
          }
        } while (iVar30 == 0);
      } while ((iVar30 != 6) || (uVar31 = (ulong)((uint)uVar35 & 0xf), uVar31 == 8));
      lVar34 = 0;
      bVar27 = 0;
      do {
        bVar33 = bVar27;
        uVar7 = *(uint *)((uVar35 & 0xfffffffffffffff0) + lVar34 * 8);
        this = (context->scene->geometries).items[uVar7].ptr;
        context->geomID = uVar7;
        context->primID = *(uint *)((uVar35 & 0xfffffffffffffff0) + 4 + lVar34 * 8);
        bVar28 = Geometry::pointQuery(this,query,context);
        lVar34 = lVar34 + 1;
        bVar27 = bVar33 | bVar28;
      } while (uVar31 - 8 != lVar34);
      auVar51 = ZEXT1664(auVar50);
      auVar38 = vpmovsxbd_avx2(ZEXT816(0x706050403020100));
      auVar53 = ZEXT3264(auVar38);
      auVar54 = ZEXT3264(CONCAT428(0xfffffff8,
                                   CONCAT424(0xfffffff8,
                                             CONCAT420(0xfffffff8,
                                                       CONCAT416(0xfffffff8,
                                                                 CONCAT412(0xfffffff8,
                                                                           CONCAT48(0xfffffff8,
                                                                                                                                                                        
                                                  0xfffffff8fffffff8)))))));
      in_ZMM7 = ZEXT3264(in_ZMM7._0_32_);
      in_ZMM15 = ZEXT3264(auVar55._0_32_);
    } while (bVar33 == 0 && !bVar28);
    uVar5 = *(undefined4 *)&(context->query_radius).field_0;
    auVar42._4_4_ = uVar5;
    auVar42._0_4_ = uVar5;
    auVar42._8_4_ = uVar5;
    auVar42._12_4_ = uVar5;
    auVar42._16_4_ = uVar5;
    auVar42._20_4_ = uVar5;
    auVar42._24_4_ = uVar5;
    auVar42._28_4_ = uVar5;
    uVar5 = *(undefined4 *)((long)&(context->query_radius).field_0 + 4);
    auVar43._4_4_ = uVar5;
    auVar43._0_4_ = uVar5;
    auVar43._8_4_ = uVar5;
    auVar43._12_4_ = uVar5;
    auVar43._16_4_ = uVar5;
    auVar43._20_4_ = uVar5;
    auVar43._24_4_ = uVar5;
    auVar43._28_4_ = uVar5;
    uVar5 = *(undefined4 *)((long)&(context->query_radius).field_0 + 8);
    auVar38._4_4_ = uVar5;
    auVar38._0_4_ = uVar5;
    auVar38._8_4_ = uVar5;
    auVar38._12_4_ = uVar5;
    auVar38._16_4_ = uVar5;
    auVar38._20_4_ = uVar5;
    auVar38._24_4_ = uVar5;
    auVar38._28_4_ = uVar5;
    if (context->query_type == POINT_QUERY_TYPE_SPHERE) {
      auVar51 = ZEXT464((uint)(query->radius * query->radius));
    }
    else {
      aVar6 = (context->query_radius).field_0;
      auVar50 = vdpps_avx((undefined1  [16])aVar6,(undefined1  [16])aVar6,0x7f);
      auVar51 = ZEXT1664(auVar50);
    }
    bVar29 = true;
  } while( true );
}

Assistant:

static __forceinline bool pointQuery(const Accel::Intersectors* This, PointQuery* query, PointQueryContext* context)
      {
        const BVH* __restrict__ bvh = (const BVH*)This->ptr;
        
        /* we may traverse an empty BVH in case all geometry was invalid */
        if (bvh->root == BVH::emptyNode)
          return false;
        
        /* stack state */
        StackItemT<NodeRef> stack[stackSize];    // stack of nodes
        StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
        StackItemT<NodeRef>* stackEnd = stack+stackSize;
        stack[0].ptr  = bvh->root;
        stack[0].dist = neg_inf;
        
        /* verify correct input */
        assert(!(types & BVH_MB) || (query->time >= 0.0f && query->time <= 1.0f));

        /* load the point query into SIMD registers */
        TravPointQuery<N> tquery(query->p, context->query_radius);

        /* initialize the node traverser */
        BVHNNodeTraverser1Hit<N,types> nodeTraverser;

        bool changed = false;
        float cull_radius = context->query_type == POINT_QUERY_TYPE_SPHERE
                          ? query->radius * query->radius
                          : dot(context->query_radius, context->query_radius);

        /* pop loop */
        while (true) pop:
        {
          /* pop next node */
          if (unlikely(stackPtr == stack)) break;
          stackPtr--;
          NodeRef cur = NodeRef(stackPtr->ptr);

          /* if popped node is too far, pop next one */
          if (unlikely(*(float*)&stackPtr->dist > cull_radius))
            continue;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(point_query.trav_nodes,1,1,1);
            bool nodeIntersected;
            if (likely(context->query_type == POINT_QUERY_TYPE_SPHERE)) {
              nodeIntersected = BVHNNodePointQuerySphere1<N, types>::pointQuery(cur, tquery, query->time, tNear, mask);
            } else {
              nodeIntersected = BVHNNodePointQueryAABB1  <N, types>::pointQuery(cur, tquery, query->time, tNear, mask);
            }
            if (unlikely(!nodeIntersected)) { STAT3(point_query.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(point_query.trav_leaves,1,1,1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
          size_t lazy_node = 0;
          if (PrimitiveIntersector1::pointQuery(This, query, context, prim, num, tquery, lazy_node))
          {
            changed = true;
            tquery.rad = context->query_radius;
            cull_radius = context->query_type == POINT_QUERY_TYPE_SPHERE
                        ? query->radius * query->radius
                        : dot(context->query_radius, context->query_radius);
          }

          /* push lazy node onto stack */
          if (unlikely(lazy_node)) {
            stackPtr->ptr = lazy_node;
            stackPtr->dist = neg_inf;
            stackPtr++;
          }
        }
        return changed;
      }